

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O2

string * __thiscall
Label::writeXml_abi_cxx11_(string *__return_storage_ptr__,Label *this,int indent)

{
  int indent_00;
  ostream *poVar1;
  int level;
  int level_00;
  stringstream str;
  allocator local_2b1;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  string local_1d0;
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  Util::getIndent_abi_cxx11_(&local_2b0,(Util *)(ulong)(uint)indent,level);
  poVar1 = std::operator<<(local_1a0,(string *)&local_2b0);
  std::operator<<(poVar1,"<Label");
  std::__cxx11::string::~string((string *)&local_2b0);
  Widget::writeXmlAttributes(&this->super_Widget,(stringstream *)local_1b0);
  poVar1 = std::operator<<(local_1a0,">");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::string((string *)&local_1d0,"Text",(allocator *)&local_2b0);
  std::__cxx11::string::string((string *)&local_1f0,(string *)&this->text);
  indent_00 = indent + 1;
  Util::writeXmlElement<std::__cxx11::string>
            ((stringstream *)local_1b0,indent_00,&local_1d0,&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::string((string *)&local_210,"FontData",&local_2b1);
  FontData::writeXml(&local_2b0,&this->font,indent_00,&local_210);
  std::operator<<(local_1a0,(string *)&local_2b0);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::string((string *)&local_230,"TextTrimming",(allocator *)&local_2b0);
  Util::writeXmlElement<TextTrimming>
            ((stringstream *)local_1b0,indent_00,&local_230,this->textTrimming);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::string((string *)&local_250,"HasTextShadow",(allocator *)&local_2b0);
  Util::writeXmlElement<bool>((stringstream *)local_1b0,indent_00,&local_250,this->hasTextShadow);
  std::__cxx11::string::~string((string *)&local_250);
  TextShadow::writeXml_abi_cxx11_(&local_2b0,&this->textShadow,indent_00);
  std::operator<<(local_1a0,(string *)&local_2b0);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::string((string *)&local_270,"HorizontalAlignment",(allocator *)&local_2b0);
  Util::writeXmlElement<HorizontalAlignment>
            ((stringstream *)local_1b0,indent_00,&local_270,this->horizontalAlignment);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::string((string *)&local_290,"VerticalAlignment",(allocator *)&local_2b0);
  Util::writeXmlElement<VerticalAlignment>
            ((stringstream *)local_1b0,indent_00,&local_290,this->verticalAlignment);
  std::__cxx11::string::~string((string *)&local_290);
  Util::getIndent_abi_cxx11_(&local_2b0,(Util *)(ulong)(uint)indent,level_00);
  poVar1 = std::operator<<(local_1a0,(string *)&local_2b0);
  std::operator<<(poVar1,"</Label>");
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

std::string Label::writeXml(int indent)
{
	std::stringstream str;
	str << Util::getIndent(indent) << "<Label";

	Widget::writeXmlAttributes(str);
	str << ">" << std::endl;

	Util::writeXmlElement(str, indent + 1, "Text", text);
	str << font.writeXml(indent + 1);
	Util::writeXmlElement(str, indent + 1, "TextTrimming", textTrimming);
	Util::writeXmlElement(str, indent + 1, "HasTextShadow", hasTextShadow);
	str << textShadow.writeXml(indent + 1);
	Util::writeXmlElement(str, indent + 1, "HorizontalAlignment", horizontalAlignment);
	Util::writeXmlElement(str, indent + 1, "VerticalAlignment", verticalAlignment);

	str << Util::getIndent(indent) << "</Label>";

	return str.str();
}